

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<_66e59461_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEqu...agnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>>
::
emplace<slang::DiagCode_const&,ska::flat_hash_map<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>,slang::Hasher<slang::DiagCode>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEqu___agnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>>
           *this,DiagCode *key,convertible_to_value *args)

{
  EntryPointer psVar1;
  DiagCode DVar2;
  EntryPointer psVar3;
  char distance_from_desired;
  long lVar4;
  EntryPointer current_entry;
  pair<_66e59461_> pVar5;
  
  lVar4 = ((ulong)CONCAT22(key->subsystem,key->code) * -0x61c8864680b583eb >>
          ((byte)this[0x10] & 0x3f)) * 0x30;
  current_entry = (EntryPointer)(*(long *)this + lVar4);
  if (*(char *)(*(long *)this + lVar4) < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar3 = current_entry;
    do {
      DVar2 = (psVar3->field_1).value.first;
      if (key->subsystem == DVar2.subsystem && (uint)DVar2 >> 0x10 == (uint)key->code) {
        pVar5._8_8_ = 0;
        pVar5.first.current = psVar3;
        return pVar5;
      }
      current_entry = psVar3 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar3 + 1;
      psVar3 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar5 = emplace_new_key<slang::DiagCode_const&,ska::flat_hash_map<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>,slang::Hasher<slang::DiagCode>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>::convertible_to_value>
                    (this,distance_from_desired,current_entry,key,args);
  return pVar5;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }